

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O3

Diagnostic * __thiscall
slang::parsing::ParserBase::addDiag(ParserBase *this,DiagCode code,SourceLocation location)

{
  SourceLocation SVar1;
  Diagnostic *pDVar2;
  Token TVar3;
  string_view sVar4;
  Token last;
  Token local_30;
  
  TVar3 = peek(this);
  if (TVar3.kind == EndOfFile) {
    local_30 = peek(this);
    SVar1 = Token::location(&local_30);
    if (SVar1 == location) {
      local_30 = (this->window).lastConsumed;
      if ((this->window).lastConsumed.info != (Info *)0x0) {
        SVar1 = Token::location(&local_30);
        sVar4 = Token::rawText(&local_30);
        location = (SourceLocation)(sVar4._M_len * 0x10000000 + (long)SVar1);
      }
    }
  }
  pDVar2 = Diagnostics::add(((this->window).tokenSource)->diagnostics,code,location);
  return pDVar2;
}

Assistant:

Diagnostic& ParserBase::addDiag(DiagCode code, SourceLocation location) {
    // If we issued this error in response to seeing an EOF token, back up and put
    // the error on the last consumed token instead.
    if (peek(TokenKind::EndOfFile) && peek().location() == location) {
        Token last = getLastConsumed();
        if (last)
            location = last.location() + last.rawText().size();
    }

    return getDiagnostics().add(code, location);
}